

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_exception.hpp
# Opt level: O1

string * __thiscall
iutest::detail::FormatCxxException_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *description)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  iu_stringstream strm;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (this == (detail *)0x0) {
    lVar2 = 0x15;
    pcVar3 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"C++ exception with description \"",0x20);
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)this,sVar1);
    lVar2 = 1;
    pcVar3 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,lVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatCxxException(const char* description)
{
    iu_stringstream strm;
    if( description != NULL )
    {
        strm << "C++ exception with description \"" << description << "\"";
    }
    else
    {
        strm << "Unknown C++ exception";
    }
    return strm.str();
}